

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O3

void DC16NoLeft_C(uint8_t *dst)

{
  uint8_t *puVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  ulong uVar5;
  undefined1 auVar6 [13];
  long lVar7;
  undefined1 uVar8;
  int iVar9;
  undefined4 uVar10;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar11 [16];
  
  iVar9 = 8;
  iVar12 = 0;
  iVar13 = 0;
  iVar14 = 0;
  lVar7 = -0x10;
  do {
    uVar10 = *(undefined4 *)(dst + lVar7 + -0x10);
    uVar5 = (ulong)(ushort)uVar10 & 0xffffffffffff00ff;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar5;
    auVar2[0xc] = (char)((uint)uVar10 >> 0x18);
    auVar3[8] = (char)((uint)uVar10 >> 0x10);
    auVar3._0_8_ = uVar5;
    auVar3[9] = 0;
    auVar3._10_3_ = auVar2._10_3_;
    auVar6._5_8_ = 0;
    auVar6._0_5_ = auVar3._8_5_;
    auVar4[4] = (char)((uint)uVar10 >> 8);
    auVar4._0_4_ = (int)uVar5;
    auVar4[5] = 0;
    auVar4._6_7_ = SUB137(auVar6 << 0x40,6);
    iVar9 = iVar9 + (int)uVar5;
    iVar12 = iVar12 + auVar4._4_4_;
    iVar13 = iVar13 + auVar3._8_4_;
    iVar14 = iVar14 + (uint)(uint3)(auVar2._10_3_ >> 0x10);
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0);
  lVar7 = 0;
  uVar8 = (undefined1)((uint)(iVar14 + iVar12 + iVar13 + iVar9) >> 4);
  auVar11 = ZEXT216(CONCAT11(uVar8,uVar8));
  auVar11 = pshuflw(auVar11,auVar11,0);
  uVar10 = auVar11._0_4_;
  do {
    puVar1 = dst + lVar7;
    *(undefined4 *)puVar1 = uVar10;
    *(undefined4 *)(puVar1 + 4) = uVar10;
    *(undefined4 *)(puVar1 + 8) = uVar10;
    *(undefined4 *)(puVar1 + 0xc) = uVar10;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x200);
  return;
}

Assistant:

static void DC16NoLeft_C(uint8_t* dst) {  // DC with left samples not available
  int DC = 8;
  int i;
  for (i = 0; i < 16; ++i) {
    DC += dst[i - BPS];
  }
  Put16(DC >> 4, dst);
}